

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O3

void __thiscall UdpSocketTest::test1(UdpSocketTest *this)

{
  int iVar1;
  uint32_t number;
  uint32_t new_number;
  Address client_addr;
  Address server_addr;
  Socket sock;
  timespec t;
  ServerSocket server;
  Selector s;
  int local_3c8;
  int local_3c4 [5];
  undefined4 local_3b0;
  char local_39c [16];
  undefined4 local_38c;
  Address local_378 [3];
  timespec local_308;
  Address local_2f8 [3];
  Selector local_288 [632];
  
  Selector::Selector(local_288,(char *)0x0);
  JetHead::Socket::Socket((Socket *)local_378,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_2f8,false);
  local_39c[0] = '\x02';
  local_39c[1] = '\0';
  local_39c[2] = '\0';
  local_39c[3] = '\0';
  local_39c[4] = '\0';
  local_39c[5] = '\0';
  local_39c[6] = '\0';
  local_39c[7] = '\0';
  local_38c = 0x10;
  local_3c4[1] = 2;
  local_3c4[2] = 0;
  local_3b0 = 0x10;
  iVar1 = JetHead::ServerSocket::bind(local_2f8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xe7,"Bind Failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_2f8);
  JetHead::Socket::Address::setAddress(local_39c);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xed,"get local addr failed");
  }
  JetHead::Socket::setSelector((SocketListener *)local_2f8,(Selector *)&this->super_SocketListener);
  iVar1 = JetHead::Socket::connect(local_378);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xf5,"connect failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_378);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xfa,"get local addr failed");
  }
  iVar1 = JetHead::Socket::connect(local_2f8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xff,"server connet failed");
    local_3c8 = 1000;
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x105,"connect failed");
  }
  else {
    local_3c8 = 1000;
  }
  iVar1 = JetHead::Socket::write(local_378,(int)&local_3c8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x10a,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_378,(int)local_3c4);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x10f,"read failed");
  }
  if (local_3c4[0] != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x112,"Data Read failed");
  }
  local_3c8 = local_3c4[0] + 1;
  iVar1 = JetHead::Socket::write(local_378,(int)&local_3c8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x119,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_378,(int)local_3c4);
  if (local_3c4[0] != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x11e,"FAILED");
  }
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x121,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  local_308.tv_sec = 1;
  nanosleep(&local_308,(timespec *)0x0);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_2f8);
  JetHead::Socket::~Socket((Socket *)local_378);
  Selector::~Selector(local_288);
  return;
}

Assistant:

void UdpSocketTest::test1()
{	
  
    LOG_NOTICE( "UDP Test Started" );
    
    Selector s;
    
    Socket sock( false );
    ServerSocket server( false );
    Socket::Address server_addr, client_addr;
    
    int res = server.bind( server_addr );
    
    if ( res < 0 )
      TestFailed( "Bind Failed" );
    
    res = server.getLocalAddress( server_addr );
    server_addr.setAddress( "127.0.0.1" );
    
    if ( res < 0 )
      TestFailed( "get local addr failed" );
    
    LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
    
    server.setSelector( this, &s );
    res = sock.connect( server_addr );
    
    if ( res < 0 )
      TestFailed( "connect failed" );
    
    res = sock.getLocalAddress( client_addr );
    
    if ( res < 0 )
      TestFailed( "get local addr failed" );
    
    res = server.connect( client_addr );
    
    if ( res < 0 )
      TestFailed( "server connet failed" );
    
    uint32_t number = 1000;
    uint32_t new_number;
    
    if ( res < 0 )
      TestFailed( "connect failed" );
    
    res = sock.write( &number, 4 );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    res = sock.read( &new_number, 4 );
    
    if ( res < 0 )
      TestFailed( "read failed" );
    
    if ( new_number != number + 1 )
      TestFailed( "Data Read failed" );
    
    number = new_number + 1;
    
    res = sock.write( &number, 4 );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    res = sock.read( &new_number, 4 );
    
    if ( new_number != number + 1 )
      TestFailed( "FAILED" );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    LOG_NOTICE( "Data sent" );
    
    mTestState = 0;
    
    sock.close();
    
    struct timespec t;
    t.tv_sec = 1;
    nanosleep( &t, NULL );
    
    // TestPassed();
}